

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O1

void __thiscall TEST_PlayerHandTest_Sequence_Test::testBody(TEST_PlayerHandTest_Sequence_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  PlayerHand *this_00;
  initializer_list<mahjong::Tile> __l;
  allocator_type local_41;
  TestTerminatorWithoutExceptions local_40;
  undefined4 local_38;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_30;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupPlayerHandTest).h;
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,TwoOfCircles);
  mahjong::PlayerHand::add(this_00,ThreeOfCircles);
  local_40.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0xdc000000d2;
  local_38 = 0xe6;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_40;
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_30,__l,&local_41);
  mahjong::PlayerHand::bindSequence(this_00,&local_30);
  if (local_30.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pUVar2 = UtestShell::getCurrent();
  bVar1 = mahjong::PlayerHand::isClosedHand(this_00);
  local_40.super_TestTerminator._vptr_TestTerminator = (TestTerminator)&PTR_exitCurrentTest_001e08b8
  ;
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)!bVar1,"CHECK","!h.isClosedHand()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
             ,0x53,&local_40);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_40);
  return;
}

Assistant:

TEST(PlayerHandTest, Sequence)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::TwoOfCircles);
	h.add(Tile::ThreeOfCircles);

	h.bindSequence({
		Tile::OneOfCircles,
		Tile::TwoOfCircles,
		Tile::ThreeOfCircles
	});

	CHECK(!h.isClosedHand());
}